

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_ManCheckOverlap(Gia_Man_t *p,Vec_Wec_t *vGroups)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int i;
  int i_00;
  int i_01;
  int iVar3;
  
  i_00 = 0;
  do {
    if (vGroups->nSize <= i_00) {
      return;
    }
    p_00 = Vec_WecEntry(vGroups,i_00);
    for (i_01 = 0; i_01 < p_00->nSize; i_01 = i_01 + 1) {
      iVar1 = Vec_IntEntry(p_00,i_01);
      if (p_00->nSize != 1) {
        Gia_ManIncrementTravId(p);
        Str_MuxTraverse_rec(p,iVar1);
        iVar3 = 0;
        while( true ) {
          iVar2 = p_00->nSize;
          if (iVar2 <= iVar3) break;
          iVar2 = Vec_IntEntry(p_00,iVar3);
          if (iVar1 != iVar2) {
            iVar2 = Gia_ObjIsTravIdCurrentId(p,iVar2);
            if (iVar2 != 0) {
              iVar2 = p_00->nSize;
              break;
            }
          }
          iVar3 = iVar3 + 1;
        }
        if (iVar2 != iVar3) {
          for (iVar1 = 1; iVar1 < iVar2; iVar1 = iVar1 + 1) {
            iVar3 = Vec_IntEntry(p_00,iVar1);
            p_01 = Vec_WecPushLevel(vGroups);
            p_00 = Vec_WecEntry(vGroups,i_00);
            Vec_IntPush(p_01,iVar3);
            iVar2 = p_00->nSize;
          }
          Vec_IntShrink(p_00,1);
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Str_ManCheckOverlap( Gia_Man_t * p, Vec_Wec_t * vGroups )
{   // check that members of each group are not in the TFI of each other
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, n, iObj, iObj2;

//    vGroup = Vec_WecEntry(vGroups, 7);
//    Vec_IntForEachEntry( vGroup, iObj, n )
//        Gia_ManPrintCone2( p, Gia_ManObj(p, iObj) ), printf( "\n" );

    Vec_WecForEachLevel( vGroups, vGroup, i )
    Vec_IntForEachEntry( vGroup, iObj, k )
    {
        if ( Vec_IntSize(vGroup) == 1 )
            continue;
        // high light the cone
        Gia_ManIncrementTravId( p );
        Str_MuxTraverse_rec( p, iObj );
        // check that none of the others are highlighted
        Vec_IntForEachEntry( vGroup, iObj2, n )
            if ( iObj != iObj2 && Gia_ObjIsTravIdCurrentId(p, iObj2) )
                break;
        if ( n == Vec_IntSize(vGroup) )
            continue;
        // split the group into individual trees
        Vec_IntForEachEntryStart( vGroup, iObj2, n, 1 )
        {
            vGroup2 = Vec_WecPushLevel( vGroups );
            vGroup  = Vec_WecEntry( vGroups, i );
            Vec_IntPush( vGroup2, iObj2 );
        }
        Vec_IntShrink( vGroup, 1 );

/*
        // this does not work because there can be a pair of independent trees
        // with another tree squeezed in between them, so that there is a combo loop

        // divide this group
        nNew = 0;
        vGroup2 = Vec_WecPushLevel( vGroups );
        vGroup  = Vec_WecEntry( vGroups, i );
        Vec_IntForEachEntry( vGroup, iObj2, n )
        {
            if ( iObj != iObj2 && Gia_ObjIsTravIdCurrentId(p, iObj2) )
                Vec_IntPush( vGroup2, iObj2 );
            else
                Vec_IntWriteEntry( vGroup, nNew++, iObj2 );
        }
        Vec_IntShrink( vGroup, nNew );
        i--;
        break;
*/

/*
        // check that none of the others are highlighted
        Vec_IntForEachEntry( vGroup, iObj, n )
            if ( n != k && Gia_ObjIsTravIdCurrentId(p, iObj) )
            {
                printf( "Overlap of TFI cones of trees %d and %d in group %d of size %d!\n", k, n, i, Vec_IntSize(vGroup) );
                Vec_IntShrink( vGroup, 1 );
                break;
            }
*/
    }
}